

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintpreviewdialog.cpp
# Opt level: O2

void __thiscall QPrintPreviewDialogPrivate::_q_pageNumEdited(QPrintPreviewDialogPrivate *this)

{
  int page;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_48;
  bool ok;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  ok = false;
  QLineEdit::text();
  page = QString::toInt((QString *)&QStack_48,&ok,10);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
  if (ok == true) {
    QPrintPreviewWidget::setCurrentPage((QPrintPreviewWidget *)this->preview,page);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPrintPreviewDialogPrivate::_q_pageNumEdited()
{
    bool ok = false;
    int res = pageNumEdit->text().toInt(&ok);
    if (ok)
        preview->setCurrentPage(res);
}